

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_ec_cp_sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbs_len)

{
  int iVar1;
  EVP_PKEY *pkey;
  EC_KEY *eckey;
  ECDSA_SIG *s;
  size_t sVar2;
  
  pkey = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx);
  iVar1 = 0;
  if (pkey != (EVP_PKEY *)0x0 && siglen != (size_t *)0x0) {
    iVar1 = EVP_PKEY_get_base_id(pkey);
    sVar2 = 0x40;
    if (iVar1 < 0x3d3) {
      if ((iVar1 != 0x32b) && (iVar1 != 0x331)) {
        return 0;
      }
    }
    else if (iVar1 != 0x3d3) {
      if (iVar1 != 0x3d4) {
        return 0;
      }
      sVar2 = 0x80;
    }
    if (sig == (uchar *)0x0) {
      *siglen = sVar2;
    }
    else {
      eckey = (EC_KEY *)EVP_PKEY_get0(pkey);
      s = gost_ec_sign(tbs,(int)tbs_len,eckey);
      if (s == (ECDSA_SIG *)0x0) {
        return 0;
      }
      pack_sign_cp(s,(uint)sVar2 >> 1,sig,siglen);
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int pkey_gost_ec_cp_sign(EVP_PKEY_CTX *ctx, unsigned char *sig,
                                size_t *siglen, const unsigned char *tbs,
                                size_t tbs_len)
{
    ECDSA_SIG *unpacked_sig = NULL;
    EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx);
    int order = 0;

    if (!siglen)
        return 0;
    if (!pkey)
        return 0;

    switch (EVP_PKEY_base_id(pkey)) {
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        order = 64;
        break;
    case NID_id_GostR3410_2012_512:
        order = 128;
        break;
    default:
        return 0;
    }

    if (!sig) {
        *siglen = order;
        return 1;
    }
    unpacked_sig = gost_ec_sign(tbs, tbs_len, EVP_PKEY_get0(pkey));
    if (!unpacked_sig) {
        return 0;
    }
    return pack_sign_cp(unpacked_sig, order / 2, sig, siglen);
}